

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dlerror.c
# Opt level: O3

int run_test_dlerror(void)

{
  uv_loop_t *loop;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *unaff_RBX;
  uv_signal_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_e0 [56];
  uv_signal_t uStack_a8;
  char *pcStack_30;
  undefined8 local_28;
  long local_20;
  uv_lib_t local_18;
  
  local_18.handle = (void *)0x0;
  local_18.errmsg = (char *)0x0;
  pcStack_30 = (char *)0x1819e5;
  pcVar2 = uv_dlerror(&local_18);
  if (pcVar2 == (char *)0x0) {
    pcStack_30 = (char *)0x181af0;
    run_test_dlerror_cold_9();
LAB_00181af0:
    pcStack_30 = (char *)0x181af5;
    run_test_dlerror_cold_8();
LAB_00181af5:
    pcStack_30 = (char *)0x181b02;
    run_test_dlerror_cold_1();
LAB_00181b02:
    pcStack_30 = (char *)0x181b07;
    run_test_dlerror_cold_7();
LAB_00181b07:
    pcStack_30 = (char *)0x181b0f;
    run_test_dlerror_cold_2();
LAB_00181b0f:
    pcVar2 = unaff_RBX;
    pcStack_30 = (char *)0x181b14;
    run_test_dlerror_cold_5();
LAB_00181b14:
    pcStack_30 = (char *)0x181b1c;
    run_test_dlerror_cold_3();
LAB_00181b1c:
    pcStack_30 = (char *)0x181b21;
    run_test_dlerror_cold_6();
  }
  else {
    pcStack_30 = (char *)0x1819fd;
    pcVar2 = strstr(pcVar2,"no error");
    if (pcVar2 == (char *)0x0) goto LAB_00181af0;
    pcStack_30 = (char *)0x181a17;
    iVar1 = uv_dlopen("test/fixtures/load_error.node",&local_18);
    local_20 = (long)iVar1;
    local_28 = 0xffffffffffffffff;
    if (local_20 != -1) goto LAB_00181af5;
    pcStack_30 = (char *)0x181a3f;
    pcVar2 = uv_dlerror(&local_18);
    if (pcVar2 == (char *)0x0) goto LAB_00181b02;
    pcStack_30 = (char *)0x181a5a;
    pcVar3 = strstr(pcVar2,"Dynamic loading not supported");
    if (pcVar3 == (char *)0x0) {
      pcStack_30 = (char *)0x181a6e;
      pcVar3 = strstr(pcVar2,"test/fixtures/load_error.node");
      if (pcVar3 != (char *)0x0) goto LAB_00181a77;
      goto LAB_00181b1c;
    }
LAB_00181a77:
    pcStack_30 = (char *)0x181a86;
    pcVar3 = strstr(pcVar2,"no error");
    unaff_RBX = pcVar2;
    if (pcVar3 != (char *)0x0) goto LAB_00181b07;
    pcStack_30 = (char *)0x181a95;
    pcVar2 = uv_dlerror(&local_18);
    if (pcVar2 == (char *)0x0) goto LAB_00181b0f;
    pcStack_30 = (char *)0x181aac;
    pcVar3 = strstr(pcVar2,"Dynamic loading not supported");
    if (pcVar3 != (char *)0x0) {
LAB_00181ac5:
      pcStack_30 = (char *)0x181ad4;
      pcVar3 = strstr(pcVar2,"no error");
      if (pcVar3 == (char *)0x0) {
        pcStack_30 = (char *)0x181ae3;
        uv_dlclose(&local_18);
        return 0;
      }
      goto LAB_00181b14;
    }
    pcStack_30 = (char *)0x181ac0;
    pcVar3 = strstr(pcVar2,"test/fixtures/load_error.node");
    if (pcVar3 != (char *)0x0) goto LAB_00181ac5;
  }
  pcStack_30 = (char *)0x181b26;
  run_test_dlerror_cold_4();
  pcStack_30 = pcVar2;
  iov = uv_buf_init(buf,0x20);
  ::loop = uv_default_loop();
  iVar1 = uv_signal_init(::loop,(uv_signal_t *)(auStack_e0 + 0x38));
  auStack_e0._16_8_ = SEXT48(iVar1);
  auStack_e0._8_8_ = (uv_loop_t *)0x0;
  if (auStack_e0._16_8_ == 0) {
    iVar1 = uv_signal_start((uv_signal_t *)(auStack_e0 + 0x38),sig_func,10);
    auStack_e0._16_8_ = SEXT48(iVar1);
    auStack_e0._8_8_ = (uv_loop_t *)0x0;
    if (auStack_e0._16_8_ != 0) goto LAB_00181dcf;
    iVar1 = pipe(pipe_fds);
    auStack_e0._16_8_ = SEXT48(iVar1);
    auStack_e0._8_8_ = (uv_loop_t *)0x0;
    if (auStack_e0._16_8_ != 0) goto LAB_00181dde;
    iVar1 = uv_thread_create((uv_thread_t *)(auStack_e0 + 8),thread_main,auStack_e0 + 0x10);
    auStack_e0._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_e0._0_8_ != (void *)0x0) goto LAB_00181ded;
    iVar1 = uv_fs_read(::loop,&read_req,pipe_fds[0],&iov,1,-1,(uv_fs_cb)0x0);
    auStack_e0._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_e0._0_8_ != (void *)0xd) goto LAB_00181dfc;
    iVar1 = strcmp(buf,test_buf);
    auStack_e0._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_e0._0_8_ != (void *)0x0) goto LAB_00181e0b;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    auStack_e0._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_e0._0_8_ != (void *)0x0) goto LAB_00181e1a;
    iVar1 = close(pipe_fds[0]);
    auStack_e0._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_e0._0_8_ != (void *)0x0) goto LAB_00181e29;
    iVar1 = close(pipe_fds[1]);
    auStack_e0._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_e0._0_8_ != (void *)0x0) goto LAB_00181e38;
    uv_close((uv_handle_t *)(auStack_e0 + 0x38),(uv_close_cb)0x0);
    iVar1 = uv_thread_join((uv_thread_t *)(auStack_e0 + 8));
    loop = ::loop;
    auStack_e0._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_e0._0_8_ == (void *)0x0) {
      uv_walk(::loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      auStack_e0._0_8_ = (void *)0x0;
      iVar1 = uv_loop_close(::loop);
      if ((void *)auStack_e0._0_8_ == (void *)(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00181e56;
    }
  }
  else {
    run_test_eintr_handling_cold_1();
LAB_00181dcf:
    run_test_eintr_handling_cold_2();
LAB_00181dde:
    run_test_eintr_handling_cold_3();
LAB_00181ded:
    run_test_eintr_handling_cold_4();
LAB_00181dfc:
    run_test_eintr_handling_cold_5();
LAB_00181e0b:
    run_test_eintr_handling_cold_6();
LAB_00181e1a:
    run_test_eintr_handling_cold_7();
LAB_00181e29:
    run_test_eintr_handling_cold_8();
LAB_00181e38:
    run_test_eintr_handling_cold_9();
  }
  run_test_eintr_handling_cold_10();
LAB_00181e56:
  handle = (uv_signal_t *)auStack_e0;
  run_test_eintr_handling_cold_11();
  if ((handle->flags & 3) == 0) {
    uv__signal_stop(handle);
    return 0;
  }
  __assert_fail("!uv__is_closing(handle)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/signal.c"
                ,0x1e8,"int uv_signal_stop(uv_signal_t *)");
}

Assistant:

TEST_IMPL(dlerror) {
  const char* path = "test/fixtures/load_error.node";
  const char* dlerror_no_error = "no error";
  const char* msg;
  uv_lib_t lib;
  int r;

  lib.errmsg = NULL;
  lib.handle = NULL;
  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
  ASSERT_NOT_NULL(strstr(msg, dlerror_no_error));

  r = uv_dlopen(path, &lib);
  ASSERT_EQ(r, -1);

  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
#if !defined(__OpenBSD__) && !defined(__QNX__)
  /* musl's libc.a does not support dlopen(), only libc.so does. */
  if (NULL == strstr(msg, "Dynamic loading not supported"))
    ASSERT_NOT_NULL(strstr(msg, path));
#endif
  ASSERT_NULL(strstr(msg, dlerror_no_error));

  /* Should return the same error twice in a row. */
  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
#if !defined(__OpenBSD__) && !defined(__QNX__)
  /* musl's libc.a does not support dlopen(), only libc.so does. */
  if (NULL == strstr(msg, "Dynamic loading not supported"))
    ASSERT_NOT_NULL(strstr(msg, path));
#endif
  ASSERT_NULL(strstr(msg, dlerror_no_error));

  uv_dlclose(&lib);

  return 0;
}